

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O2

uint8_t __thiscall ki::protocol::dml::MessageTemplate::get_access_level(MessageTemplate *this)

{
  Record *this_00;
  uint8_t uVar1;
  Field<unsigned_char> *pFVar2;
  allocator local_31;
  string local_30;
  
  this_00 = this->m_record;
  std::__cxx11::string::string((string *)&local_30,"_MsgAccessLvl",&local_31);
  pFVar2 = ki::dml::Record::get_field<unsigned_char>(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (pFVar2 == (Field<unsigned_char> *)0x0) {
    uVar1 = '\0';
  }
  else {
    uVar1 = pFVar2->m_value;
  }
  return uVar1;
}

Assistant:

uint8_t MessageTemplate::get_access_level() const
	{
		const auto field = m_record->get_field<ki::dml::UBYT>("_MsgAccessLvl");
		if (field)
			return field->get_value();
		return 0;
	}